

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

int stbir__edge_wrap(stbir_edge edge,int n,int max)

{
  int iVar1;
  int iVar2;
  
  if (-1 < n && n < max) {
    return n;
  }
  if (edge == STBIR_EDGE_WRAP) {
    iVar1 = n % max;
    if (n < 0) {
      iVar2 = max + iVar1;
      if (iVar1 == 0) {
        iVar2 = 0;
      }
      return iVar2;
    }
  }
  else {
    if (edge == STBIR_EDGE_REFLECT) {
      if (n < 0) {
        if (n < max) {
          return -n;
        }
        return max + -1;
      }
      if (n < max) {
        return n;
      }
      iVar1 = ~n + max * 2;
      if (max * 2 <= n) {
        iVar1 = 0;
      }
      return iVar1;
    }
    iVar1 = 0;
    if ((edge == STBIR_EDGE_CLAMP) && (-1 < n)) {
      iVar1 = max + -1;
      if (n < max) {
        iVar1 = n;
      }
      return iVar1;
    }
  }
  return iVar1;
}

Assistant:

stbir__inline static int stbir__edge_wrap(stbir_edge edge, int n, int max)
{
    // avoid per-pixel switch
    if (n >= 0 && n < max)
        return n;
    return stbir__edge_wrap_slow(edge, n, max);
}